

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv_ip4_addr(char *ip,int port,sockaddr_in *addr)

{
  uint16_t uVar1;
  int iVar2;
  sockaddr_in *addr_local;
  int port_local;
  char *ip_local;
  
  memset(addr,0,0x10);
  addr->sin_family = 2;
  uVar1 = htons((uint16_t)port);
  addr->sin_port = uVar1;
  iVar2 = uv_inet_pton(2,ip,&addr->sin_addr);
  return iVar2;
}

Assistant:

int uv_ip4_addr(const char* ip, int port, struct sockaddr_in* addr) {
  memset(addr, 0, sizeof(*addr));
  addr->sin_family = AF_INET;
  addr->sin_port = htons(port);
#ifdef SIN6_LEN
  addr->sin_len = sizeof(*addr);
#endif
  return uv_inet_pton(AF_INET, ip, &(addr->sin_addr.s_addr));
}